

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_holder<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)>::cni_holder
          (cni_holder<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)> *this,_func_bool_tm_ptr **func)

{
  function<bool_(const_tm_&)> *in_RDI;
  cni_helper<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)> *this_00;
  function<bool_(const_tm_&)> *in_stack_ffffffffffffffc0;
  _func_bool_tm_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006b8b68;
  this_00 = (cni_helper<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)> *)
            ((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<bool(tm_const&)>::function<bool(*const&)(tm_const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<bool_(*)(const_tm_&),_bool_(*)(const_tm_&)>::cni_helper(this_00,in_RDI);
  std::function<bool_(const_tm_&)>::~function((function<bool_(const_tm_&)> *)0x4b3906);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}